

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

matrix4d *
tinyusdz::inverse_pxr(matrix4d *__return_storage_ptr__,matrix4d *m,double *detp,double eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  
  dVar1 = m->m[0][2];
  dVar2 = m->m[0][3];
  dVar3 = m->m[1][2];
  dVar4 = m->m[1][3];
  dVar5 = m->m[2][2];
  dVar6 = m->m[2][3];
  dVar7 = m->m[3][2];
  dVar8 = m->m[3][3];
  dVar16 = dVar1 * dVar4 - dVar2 * dVar3;
  dVar26 = dVar1 * dVar6 - dVar2 * dVar5;
  dVar24 = dVar1 * dVar8 - dVar2 * dVar7;
  dVar23 = dVar3 * dVar6 - dVar4 * dVar5;
  dVar14 = dVar3 * dVar8 - dVar4 * dVar7;
  dVar18 = dVar5 * dVar8 - dVar6 * dVar7;
  dVar21 = m->m[2][1];
  dVar28 = m->m[1][1];
  dVar15 = m->m[0][1];
  dVar19 = (dVar28 * dVar26 - dVar16 * dVar21) - dVar15 * dVar23;
  dVar9 = m->m[3][1];
  dVar29 = dVar9 * dVar16 + (dVar15 * dVar14 - dVar24 * dVar28);
  dVar17 = (dVar21 * dVar24 - dVar26 * dVar9) - dVar15 * dVar18;
  dVar22 = dVar9 * dVar23 + (dVar28 * dVar18 - dVar14 * dVar21);
  dVar10 = m->m[2][0];
  dVar11 = m->m[3][0];
  dVar12 = m->m[1][0];
  dVar13 = m->m[0][0];
  dVar30 = dVar13 * dVar22 + dVar12 * dVar17 + dVar11 * dVar19 + dVar10 * dVar29;
  if (detp != (double *)0x0) {
    *detp = dVar30;
  }
  __return_storage_ptr__->m[0][0] = 1.0;
  __return_storage_ptr__->m[0][1] = 0.0;
  __return_storage_ptr__->m[0][2] = 0.0;
  __return_storage_ptr__->m[0][3] = 0.0;
  __return_storage_ptr__->m[1][0] = 0.0;
  __return_storage_ptr__->m[1][1] = 1.0;
  __return_storage_ptr__->m[1][2] = 0.0;
  __return_storage_ptr__->m[1][3] = 0.0;
  __return_storage_ptr__->m[2][0] = 0.0;
  __return_storage_ptr__->m[2][1] = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  __return_storage_ptr__->m[2][3] = 0.0;
  __return_storage_ptr__->m[3][0] = 0.0;
  __return_storage_ptr__->m[3][1] = 0.0;
  __return_storage_ptr__->m[3][2] = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  if (ABS(dVar30) <= eps) {
    __return_storage_ptr__->m[0][0] = 1.0;
    __return_storage_ptr__->m[0][3] = 0.0;
    __return_storage_ptr__->m[1][0] = 0.0;
    __return_storage_ptr__->m[0][1] = 0.0;
    __return_storage_ptr__->m[0][2] = 0.0;
    __return_storage_ptr__->m[1][1] = 1.0;
    __return_storage_ptr__->m[2][0] = 0.0;
    __return_storage_ptr__->m[2][1] = 0.0;
    __return_storage_ptr__->m[1][2] = 0.0;
    __return_storage_ptr__->m[1][3] = 0.0;
    __return_storage_ptr__->m[2][2] = 1.0;
    __return_storage_ptr__->m[3][1] = 0.0;
    __return_storage_ptr__->m[3][2] = 0.0;
    __return_storage_ptr__->m[2][3] = 0.0;
    __return_storage_ptr__->m[3][0] = 0.0;
    __return_storage_ptr__->m[3][3] = 1.0;
    __return_storage_ptr__->m[0][0] = 3.4028234663852886e+38;
    __return_storage_ptr__->m[1][1] = 3.4028234663852886e+38;
    __return_storage_ptr__->m[2][2] = 3.4028234663852886e+38;
  }
  else {
    dVar27 = dVar13 * dVar28 - dVar15 * dVar12;
    dVar20 = dVar13 * dVar21 - dVar15 * dVar10;
    dVar25 = dVar13 * dVar9 - dVar15 * dVar11;
    dVar15 = dVar12 * dVar21 - dVar28 * dVar10;
    dVar28 = dVar12 * dVar9 - dVar28 * dVar11;
    dVar21 = dVar9 * dVar10 - dVar21 * dVar11;
    dVar30 = 1.0 / dVar30;
    __return_storage_ptr__->m[0][0] = dVar22 * dVar30;
    __return_storage_ptr__->m[0][1] = dVar17 * dVar30;
    __return_storage_ptr__->m[1][0] =
         ((dVar10 * dVar14 - dVar23 * dVar11) - dVar12 * dVar18) * dVar30;
    __return_storage_ptr__->m[0][2] = dVar29 * dVar30;
    __return_storage_ptr__->m[2][0] = (dVar15 * dVar8 + (dVar4 * dVar21 - dVar28 * dVar6)) * dVar30;
    __return_storage_ptr__->m[0][3] = dVar19 * dVar30;
    __return_storage_ptr__->m[3][0] = ((dVar5 * dVar28 - dVar15 * dVar7) - dVar3 * dVar21) * dVar30;
    __return_storage_ptr__->m[1][1] =
         (dVar11 * dVar26 + (dVar13 * dVar18 - dVar24 * dVar10)) * dVar30;
    __return_storage_ptr__->m[1][2] =
         ((dVar12 * dVar24 - dVar16 * dVar11) - dVar13 * dVar14) * dVar30;
    __return_storage_ptr__->m[2][1] = ((dVar6 * dVar25 - dVar20 * dVar8) - dVar21 * dVar2) * dVar30;
    __return_storage_ptr__->m[1][3] =
         (dVar10 * dVar16 + (dVar13 * dVar23 - dVar26 * dVar12)) * dVar30;
    __return_storage_ptr__->m[3][1] = (dVar20 * dVar7 + (dVar1 * dVar21 - dVar25 * dVar5)) * dVar30;
    __return_storage_ptr__->m[2][2] = (dVar27 * dVar8 + (dVar2 * dVar28 - dVar25 * dVar4)) * dVar30;
    __return_storage_ptr__->m[2][3] = ((dVar4 * dVar20 - dVar27 * dVar6) - dVar2 * dVar15) * dVar30;
    __return_storage_ptr__->m[3][2] = ((dVar3 * dVar25 - dVar27 * dVar7) - dVar28 * dVar1) * dVar30;
    __return_storage_ptr__->m[3][3] = dVar30 * (dVar5 * dVar27 + (dVar1 * dVar15 - dVar20 * dVar3));
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d inverse_pxr(const value::matrix4d &m, double *detp,
                            double eps) {
  double x00, x01, x02, x03;
  double x10, x11, x12, x13;
  double x20, x21, x22, x23;
  double x30, x31, x32, x33;
  double y01, y02, y03, y12, y13, y23;
  double z00, z10, z20, z30;
  double z01, z11, z21, z31;
  double z02, z03, z12, z13, z22, z23, z32, z33;

  // Pickle 1st two columns of matrix into registers
  x00 = m.m[0][0];
  x01 = m.m[0][1];
  x10 = m.m[1][0];
  x11 = m.m[1][1];
  x20 = m.m[2][0];
  x21 = m.m[2][1];
  x30 = m.m[3][0];
  x31 = m.m[3][1];

  // Compute all six 2x2 determinants of 1st two columns
  y01 = x00 * x11 - x10 * x01;
  y02 = x00 * x21 - x20 * x01;
  y03 = x00 * x31 - x30 * x01;
  y12 = x10 * x21 - x20 * x11;
  y13 = x10 * x31 - x30 * x11;
  y23 = x20 * x31 - x30 * x21;

  // Pickle 2nd two columns of matrix into registers
  x02 = m.m[0][2];
  x03 = m.m[0][3];
  x12 = m.m[1][2];
  x13 = m.m[1][3];
  x22 = m.m[2][2];
  x23 = m.m[2][3];
  x32 = m.m[3][2];
  x33 = m.m[3][3];

  // Compute all 3x3 cofactors for 2nd two columns */
  z33 = x02 * y12 - x12 * y02 + x22 * y01;
  z23 = x12 * y03 - x32 * y01 - x02 * y13;
  z13 = x02 * y23 - x22 * y03 + x32 * y02;
  z03 = x22 * y13 - x32 * y12 - x12 * y23;
  z32 = x13 * y02 - x23 * y01 - x03 * y12;
  z22 = x03 * y13 - x13 * y03 + x33 * y01;
  z12 = x23 * y03 - x33 * y02 - x03 * y23;
  z02 = x13 * y23 - x23 * y13 + x33 * y12;

  // Compute all six 2x2 determinants of 2nd two columns
  y01 = x02 * x13 - x12 * x03;
  y02 = x02 * x23 - x22 * x03;
  y03 = x02 * x33 - x32 * x03;
  y12 = x12 * x23 - x22 * x13;
  y13 = x12 * x33 - x32 * x13;
  y23 = x22 * x33 - x32 * x23;

  // Compute all 3x3 cofactors for 1st two columns
  z30 = x11 * y02 - x21 * y01 - x01 * y12;
  z20 = x01 * y13 - x11 * y03 + x31 * y01;
  z10 = x21 * y03 - x31 * y02 - x01 * y23;
  z00 = x11 * y23 - x21 * y13 + x31 * y12;
  z31 = x00 * y12 - x10 * y02 + x20 * y01;
  z21 = x10 * y03 - x30 * y01 - x00 * y13;
  z11 = x00 * y23 - x20 * y03 + x30 * y02;
  z01 = x20 * y13 - x30 * y12 - x10 * y23;

  // compute 4x4 determinant & its reciprocal
  double det = x30 * z30 + x20 * z20 + x10 * z10 + x00 * z00;
  if (detp) {
    *detp = det;
  }

  value::matrix4d inv;

  if (std::fabs(det) > eps) {
    double rcp = 1.0 / det;
    // Multiply all 3x3 cofactors by reciprocal & transpose
    inv.m[0][0] = z00 * rcp;
    inv.m[0][1] = z10 * rcp;
    inv.m[1][0] = z01 * rcp;
    inv.m[0][2] = z20 * rcp;
    inv.m[2][0] = z02 * rcp;
    inv.m[0][3] = z30 * rcp;
    inv.m[3][0] = z03 * rcp;
    inv.m[1][1] = z11 * rcp;
    inv.m[1][2] = z21 * rcp;
    inv.m[2][1] = z12 * rcp;
    inv.m[1][3] = z31 * rcp;
    inv.m[3][1] = z13 * rcp;
    inv.m[2][2] = z22 * rcp;
    inv.m[2][3] = z32 * rcp;
    inv.m[3][2] = z23 * rcp;
    inv.m[3][3] = z33 * rcp;

  } else {
    inv = value::matrix4d::identity();
    // scale = FLT_MAX
    inv.m[0][0] = double((std::numeric_limits<float>::max)());
    inv.m[1][1] = double((std::numeric_limits<float>::max)());
    inv.m[2][2] = double((std::numeric_limits<float>::max)());
    // [3][3] = 1.0
  }

  return inv;
}